

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O1

DecoratorDataHandle __thiscall
Rml::DecoratorRadialGradient::GenerateElementData
          (DecoratorRadialGradient *this,Element *element,BoxArea paint_area)

{
  int iVar1;
  int iVar2;
  PoolNode *pPVar3;
  code *pcVar4;
  Vector2f VVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  bool bVar10;
  Vertex *vertex;
  RenderManager *mesh_00;
  ComputedValues *pCVar11;
  pointer pVVar12;
  Pool<Rml::ShaderElementData> *this_00;
  PoolNode *pPVar13;
  long lVar14;
  Variant *this_01;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float gradient_line_length;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar15;
  RadialGradientShape RVar16;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
  init;
  CompiledShader shader;
  ColorStopList resolved_stops;
  RenderBox render_box;
  Mesh mesh;
  allocator_type local_2b2;
  key_compare local_2b1;
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [40];
  ColorStopList local_278;
  undefined1 local_260 [32];
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_240;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  Variant local_200;
  Variant local_1d8;
  Variant local_1b0;
  RenderBox local_188;
  undefined1 local_158 [40];
  pointer piStack_130;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  local_110;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  local_c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  local_80;
  
  mesh_00 = Element::GetRenderManager(element);
  if (mesh_00 == (RenderManager *)0x0) {
    pPVar13 = (PoolNode *)0x0;
  }
  else {
    if ((((this->color_stops).super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          (this->color_stops).super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>.
          _M_impl.super__Vector_impl_data._M_finish) || (Ellipse < this->shape)) &&
       (bVar10 = Assert("RMLUI_ASSERT(!color_stops.empty() && (shape == Shape::Circle || shape == Shape::Ellipse))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DecoratorGradient.cpp"
                        ,0x1b6), !bVar10)) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    Element::GetRenderBox(&local_188,element,paint_area,0);
    RVar16 = CalculateRadialGradientShape(this,element,local_188.fill_size);
    local_218._8_4_ = extraout_XMM0_Dc;
    local_218._0_4_ = RVar16.center.x;
    local_218._4_4_ = RVar16.center.y;
    local_218._12_4_ = extraout_XMM0_Dd;
    gradient_line_length = RVar16.radius.x;
    fVar15 = gradient_line_length;
    if (RVar16.radius.y <= gradient_line_length) {
      fVar15 = RVar16.radius.y;
    }
    local_228._8_4_ = in_XMM1_Dc;
    local_228._0_4_ = RVar16.radius.x;
    local_228._4_4_ = RVar16.radius.y;
    local_228._12_4_ = in_XMM1_Dd;
    ResolveColorStops(&local_278,element,gradient_line_length,1.0 / fVar15,&this->color_stops);
    local_260._0_8_ = (pointer)(local_260 + 0x10);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"radial-gradient","");
    local_2a0._0_8_ = (RenderManager *)0x2d;
    Variant::Set((Variant *)local_2a0,(Vector2f)local_218._0_8_);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
    ::pair<const_char_(&)[7],_Rml::Variant,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
                *)local_158,(char (*) [7])"center",(Variant *)local_2a0);
    local_1b0.type = NONE;
    Variant::Set(&local_1b0,(Vector2f)local_228._0_8_);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
    ::pair<const_char_(&)[7],_Rml::Variant,_true>(&local_110,(char (*) [7])0x2def2c,&local_1b0);
    local_1d8.type = NONE;
    Variant::Set(&local_1d8,this->repeating);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
    ::pair<const_char_(&)[10],_Rml::Variant,_true>(&local_c8,(char (*) [10])"repeating",&local_1d8);
    local_200.type = NONE;
    Variant::Set(&local_200,&local_278);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
    ::pair<const_char_(&)[16],_Rml::Variant,_true>
              (&local_80,(char (*) [16])"color_stop_list",&local_200);
    init._M_len = 4;
    init._M_array = (iterator)local_158;
    itlib::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
    ::flat_map(&local_240,init,&local_2b1,&local_2b2);
    RenderManager::CompileShader
              ((RenderManager *)local_2b0,(String *)mesh_00,(Dictionary *)local_260);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ::~vector(&local_240.m_container);
    lVar14 = -0x120;
    this_01 = &local_80.second;
    do {
      Variant::~Variant(this_01);
      if ((long *)(this_01[-1].data + 0x10) != *(long **)this_01[-1].data) {
        operator_delete(*(long **)this_01[-1].data,*(long *)(this_01[-1].data + 0x10) + 1);
      }
      this_01 = (Variant *)this_01[-2].data;
      lVar14 = lVar14 + 0x48;
    } while (lVar14 != 0);
    Variant::~Variant(&local_200);
    Variant::~Variant(&local_1d8);
    Variant::~Variant(&local_1b0);
    Variant::~Variant((Variant *)local_2a0);
    if ((pointer)local_260._0_8_ != (pointer)(local_260 + 0x10)) {
      operator_delete((void *)local_260._0_8_,local_260._16_8_ + 1);
    }
    if ((pointer)local_2b0._8_8_ == (pointer)0x0) {
      pPVar13 = (PoolNode *)0x0;
    }
    else {
      local_158._32_8_ = (pointer)0x0;
      piStack_130 = (pointer)0x0;
      local_158._16_8_ = 0;
      local_158._24_8_ = (void *)0x0;
      local_158._0_8_ = (pointer)0x0;
      local_158._8_8_ = (pointer)0x0;
      pCVar11 = Element::GetComputedValues(element);
      MeshUtilities::GenerateBackground
                ((Mesh *)local_158,&local_188,
                 (ColourbPremultiplied)
                 (((int)((pCVar11->inherited).opacity * 255.0) & 0xffU) * 0x1010101));
      for (pVVar12 = (pointer)local_158._0_8_; pVVar12 != (pointer)local_158._8_8_;
          pVVar12 = pVVar12 + 1) {
        VVar5.y = (pVVar12->position).y - local_188.border_widths._M_elems[0];
        VVar5.x = (pVVar12->position).x - local_188.border_widths._M_elems[3];
        pVVar12->tex_coord = VVar5;
      }
      this_00 = GetShaderElementDataPool();
      RenderManager::MakeGeometry((RenderManager *)local_2a0,(Mesh *)mesh_00);
      if ((this_00->first_free_node == (PoolNode *)0x0) &&
         ((this_00->grow != true ||
          (Pool<Rml::ShaderElementData>::CreateChunk(this_00),
          this_00->first_free_node == (PoolNode *)0x0)))) {
        pPVar13 = (PoolNode *)0x0;
      }
      else {
        uVar9 = local_2a0._8_4_;
        uVar8 = local_2a0._0_8_;
        uVar7 = local_2b0._8_8_;
        uVar6 = local_2b0._0_8_;
        iVar2 = this_00->num_allocated_objects;
        iVar1 = iVar2 + 1;
        this_00->num_allocated_objects = iVar1;
        if (this_00->max_num_allocated_objects <= iVar2) {
          this_00->max_num_allocated_objects = iVar1;
        }
        pPVar13 = this_00->first_free_node;
        pPVar3 = pPVar13->next;
        this_00->first_free_node = pPVar3;
        if (pPVar3 != (PoolNode *)0x0) {
          pPVar3->previous = (PoolNode *)0x0;
        }
        pPVar3 = this_00->first_allocated_node;
        if (pPVar3 == (PoolNode *)0x0) {
          pPVar13->previous = (PoolNode *)0x0;
          pPVar13->next = (PoolNode *)0x0;
        }
        else {
          pPVar13->previous = (PoolNode *)0x0;
          pPVar13->next = pPVar3;
          pPVar3->previous = pPVar13;
        }
        this_00->first_allocated_node = pPVar13;
        pPVar13->object[0] = '\0';
        pPVar13->object[1] = '\0';
        pPVar13->object[2] = '\0';
        pPVar13->object[3] = '\0';
        pPVar13->object[4] = '\0';
        pPVar13->object[5] = '\0';
        pPVar13->object[6] = '\0';
        pPVar13->object[7] = '\0';
        pPVar13->object[8] = 0xff;
        pPVar13->object[9] = 0xff;
        pPVar13->object[10] = 0xff;
        pPVar13->object[0xb] = 0xff;
        local_2a0._0_8_ = (RenderManager *)0x0;
        *(undefined8 *)pPVar13->object = uVar8;
        local_2a0._8_4_ = Invalid;
        *(undefined4 *)(pPVar13->object + 8) = uVar9;
        pPVar13->object[0x10] = '\0';
        pPVar13->object[0x11] = '\0';
        pPVar13->object[0x12] = '\0';
        pPVar13->object[0x13] = '\0';
        pPVar13->object[0x14] = '\0';
        pPVar13->object[0x15] = '\0';
        pPVar13->object[0x16] = '\0';
        pPVar13->object[0x17] = '\0';
        pPVar13->object[0x18] = '\0';
        pPVar13->object[0x19] = '\0';
        pPVar13->object[0x1a] = '\0';
        pPVar13->object[0x1b] = '\0';
        pPVar13->object[0x1c] = '\0';
        pPVar13->object[0x1d] = '\0';
        pPVar13->object[0x1e] = '\0';
        pPVar13->object[0x1f] = '\0';
        local_2b0._0_8_ = (RenderManager *)0x0;
        *(undefined8 *)(pPVar13->object + 0x10) = uVar6;
        local_2b0._8_8_ = (pointer)0x0;
        *(undefined8 *)(pPVar13->object + 0x18) = uVar7;
      }
      UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
      ::ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                          *)local_2a0);
      if ((void *)local_158._24_8_ != (void *)0x0) {
        operator_delete((void *)local_158._24_8_,(long)piStack_130 - local_158._24_8_);
      }
      if ((pointer)local_158._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ - local_158._0_8_);
      }
    }
    CompiledShader::Release((CompiledShader *)local_2b0);
    if (local_278.super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_278.super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_278.
                            super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_278.
                            super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return (DecoratorDataHandle)pPVar13;
}

Assistant:

DecoratorDataHandle DecoratorRadialGradient::GenerateElementData(Element* element, BoxArea paint_area) const
{
	RenderManager* render_manager = element->GetRenderManager();
	if (!render_manager)
		return INVALID_DECORATORDATAHANDLE;

	RMLUI_ASSERT(!color_stops.empty() && (shape == Shape::Circle || shape == Shape::Ellipse));

	const RenderBox render_box = element->GetRenderBox(paint_area);
	const Vector2f dimensions = render_box.GetFillSize();

	RadialGradientShape gradient_shape = CalculateRadialGradientShape(element, dimensions);

	// One-pixel minimum color stop spacing to avoid aliasing.
	const float soft_spacing = 1.f / Math::Min(gradient_shape.radius.x, gradient_shape.radius.y);

	ColorStopList resolved_stops = ResolveColorStops(element, gradient_shape.radius.x, soft_spacing, color_stops);

	CompiledShader shader = render_manager->CompileShader("radial-gradient",
		Dictionary{
			{"center", Variant(gradient_shape.center)},
			{"radius", Variant(gradient_shape.radius)},
			{"repeating", Variant(repeating)},
			{"color_stop_list", Variant(std::move(resolved_stops))},
		});
	if (!shader)
		return INVALID_DECORATORDATAHANDLE;

	Mesh mesh;
	const ComputedValues& computed = element->GetComputedValues();
	const byte alpha = byte(computed.opacity() * 255.f);
	MeshUtilities::GenerateBackground(mesh, render_box, ColourbPremultiplied(alpha, alpha));

	const Vector2f render_offset = render_box.GetFillOffset();
	for (Vertex& vertex : mesh.vertices)
		vertex.tex_coord = vertex.position - render_offset;

	ShaderElementData* element_data =
		GetShaderElementDataPool().AllocateAndConstruct(render_manager->MakeGeometry(std::move(mesh)), std::move(shader));
	return reinterpret_cast<DecoratorDataHandle>(element_data);
}